

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

char * BuildModuleFromPath(Allocator *allocator,InplaceStr moduleName,char *moduleRoot,
                          bool addExtension,char **errorPos,char *errorBuf,uint errorBufSize,
                          int optimizationLevel,ArrayView<InplaceStr> activeImports,
                          CompilerStatistics *statistics)

{
  InplaceStr moduleName_00;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  InplaceStr moduleName_01;
  uint fileSize;
  InplaceStr moduleName_local;
  TraceScope traceScope;
  char path [1024];
  char nextModuleRootBuf [1024];
  
  moduleName_local.begin = moduleName.begin;
  moduleName_local.end._0_4_ = (int)moduleName.end;
  moduleName_local.end._4_4_ = moduleName.end._4_4_;
  if (statistics == (CompilerStatistics *)0x0) {
    NULLC::TraceDump();
  }
  else {
    uVar1 = NULLCTime::clockMicro();
    statistics->startTime = uVar1;
    statistics->finishTime = 0;
    NULLC::TraceDump();
    uVar1 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Tracing",uVar1);
    uVar1 = NULLCTime::clockMicro();
    statistics->startTime = uVar1;
    statistics->finishTime = 0;
  }
  if (BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
      ::token == '\0') {
    iVar2 = __cxa_guard_acquire(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                                 ::token);
    if (iVar2 != 0) {
      BuildModuleFromPath::token = NULLC::TraceGetToken("compiler","BuildModuleFromPath");
      __cxa_guard_release(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,BuildModuleFromPath::token);
  pcVar5 = moduleName_local.begin;
  pcVar4 = (char *)CONCAT44(moduleName_local.end._4_4_,(int)moduleName_local.end);
  moduleName_00.end._0_4_ = (int)moduleName_local.end;
  moduleName_00.begin = moduleName_local.begin;
  moduleName_00.end._4_4_ = moduleName_local.end._4_4_;
  NULLC::TraceLabel(moduleName_local.begin,pcVar4);
  if (*pcVar4 != '\0') {
    __assert_fail("*moduleName.end == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x882,
                  "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                 );
  }
  pcVar3 = strstr(pcVar5,".nc");
  if (addExtension) {
    if (pcVar3 != (char *)0x0) {
      __assert_fail("strstr(moduleName.begin, \".nc\") == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x885,
                    "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                   );
    }
  }
  else if (pcVar3 == (char *)0x0) {
    __assert_fail("strstr(moduleName.begin, \".nc\") != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x887,
                  "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                 );
  }
  fileSize = 0;
  if (moduleRoot != (char *)0x0) {
    pcVar4 = FindFileContentInImportPaths
                       (moduleName_00,moduleRoot,addExtension,path,0x400,&fileSize);
    if (pcVar4 != (char *)0x0) {
      pcVar5 = InplaceStr::rfind(&moduleName_local,'/');
      if (pcVar5 != (char *)0x0) {
        NULLC::SafeSprintf(nextModuleRootBuf,0x400,"%s/%.*s",moduleRoot,
                           (ulong)(uint)((int)pcVar5 - (int)moduleName_local.begin));
        moduleRoot = nextModuleRootBuf;
      }
      goto LAB_00134c23;
    }
    pcVar4 = (char *)CONCAT44(moduleName_local.end._4_4_,(int)moduleName_local.end);
    pcVar5 = moduleName_local.begin;
  }
  moduleName_01.end = pcVar4;
  moduleName_01.begin = pcVar5;
  pcVar4 = FindFileContentInImportPaths(moduleName_01,(char *)0x0,addExtension,path,0x400,&fileSize)
  ;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar5 = InplaceStr::rfind(&moduleName_local,'/');
    if (pcVar5 != (char *)0x0) {
      moduleRoot = nextModuleRootBuf;
      NULLC::SafeSprintf(moduleRoot,0x400,"%.*s",
                         (ulong)(uint)((int)pcVar5 - (int)moduleName_local.begin));
    }
  }
LAB_00134c23:
  if (statistics != (CompilerStatistics *)0x0) {
    uVar1 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Extra",uVar1);
  }
  if (pcVar4 == (char *)0x0) {
    *errorPos = (char *)0x0;
    if (errorBufSize == 0 || errorBuf == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (char *)0x0;
      NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,
                         "ERROR: module file \'%.*s\' could not be opened",
                         (ulong)(uint)((int)moduleName_local.end - (int)moduleName_local.begin));
    }
  }
  else {
    pcVar5 = BuildModuleFromSource
                       (allocator,path,moduleRoot,pcVar4,fileSize,errorPos,errorBuf,errorBufSize,
                        optimizationLevel,activeImports,statistics);
    (*(code *)NULLC::fileFree)(pcVar4);
  }
  NULLC::TraceScope::~TraceScope(&traceScope);
  return pcVar5;
}

Assistant:

char* BuildModuleFromPath(Allocator *allocator, InplaceStr moduleName, const char *moduleRoot, bool addExtension, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel, ArrayView<InplaceStr> activeImports, CompilerStatistics *statistics)
{
	if(statistics)
		statistics->Start(NULLCTime::clockMicro());

	NULLC::TraceDump();

	if(statistics)
	{
		statistics->Finish("Tracing", NULLCTime::clockMicro());
		statistics->Start(NULLCTime::clockMicro());
	}

	TRACE_SCOPE("compiler", "BuildModuleFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	assert(*moduleName.end == 0);

	if(addExtension)
		assert(strstr(moduleName.begin, ".nc") == NULL);
	else
		assert(strstr(moduleName.begin, ".nc") != NULL);

	const unsigned nextModuleRootLength = 1024;
	char nextModuleRootBuf[nextModuleRootLength];

	const char *nextModuleRoot = moduleRoot;

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned fileSize = 0;
	const char *fileContent = NULL;

	if(moduleRoot)
	{
		fileContent = FindFileContentInImportPaths(moduleName, moduleRoot, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%s/%.*s", moduleRoot, unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(!fileContent)
	{
		fileContent = FindFileContentInImportPaths(moduleName, NULL, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%.*s", unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(statistics)
		statistics->Finish("Extra", NULLCTime::clockMicro());

	if(!fileContent)
	{
		*errorPos = NULL;

		if(errorBuf && errorBufSize)
			NULLC::SafeSprintf(errorBuf, errorBufSize, "ERROR: module file '%.*s' could not be opened", moduleName.length(), moduleName.begin);

		return NULL;
	}

	char *bytecode = BuildModuleFromSource(allocator, path, nextModuleRoot, fileContent, fileSize, errorPos, errorBuf, errorBufSize, optimizationLevel, activeImports, statistics);

	NULLC::fileFree(fileContent);

	return bytecode;
}